

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classloader.cpp
# Opt level: O2

void __thiscall ClassLoader::setConstantPool(ClassLoader *this,FILE *fp,ClassFile *classFile)

{
  u1 uVar1;
  u2 uVar2;
  CONSTANT_InterfaceMethodref_info CVar3;
  cp_info *pcVar4;
  CONSTANT_Double_info CVar5;
  uint uVar6;
  ClassLoader *pCVar7;
  ushort uVar8;
  CONSTANT_Utf8_info CVar9;
  
  uVar6 = *(int *)&classFile->constant_pool_count - 1;
  pCVar7 = (ClassLoader *)((ulong)(uVar6 & 0xffff) * 0x18);
  pcVar4 = (cp_info *)malloc((size_t)pCVar7);
  classFile->constant_pool = pcVar4;
  uVar8 = 0;
  do {
    if ((ushort)uVar6 <= uVar8) {
      return;
    }
    uVar1 = readU1(pCVar7,fp);
    pcVar4[uVar8].tag = uVar1;
    pCVar7 = this;
    switch(uVar1) {
    case '\x01':
      CVar9 = getConstantUtf8Info(this,fp);
      pcVar4[uVar8].info.fieldref_info.class_index = CVar9.length;
      pcVar4[uVar8].info.utf8_info.bytes = CVar9.bytes;
      goto LAB_00110ca8;
    default:
      std::operator<<((ostream *)&std::cerr,
                      "Arquivo .class possui uma tag invalida no pool de constantes");
      exit(5);
    case '\x03':
    case '\x04':
      CVar3 = (CONSTANT_InterfaceMethodref_info)readU4(this,fp);
      break;
    case '\x05':
      CVar5 = (CONSTANT_Double_info)getConstantLongInfo(this,fp);
      goto LAB_00110c94;
    case '\x06':
      CVar5 = getConstantDoubleInfo(this,fp);
LAB_00110c94:
      pcVar4[uVar8].info.double_info = CVar5;
      uVar8 = uVar8 + 1;
      pcVar4[uVar8].tag = '\0';
      goto LAB_00110ca8;
    case '\a':
    case '\b':
      uVar2 = readU2(this,fp);
      pcVar4[uVar8].info.fieldref_info.class_index = uVar2;
      goto LAB_00110ca8;
    case '\t':
      CVar3 = (CONSTANT_InterfaceMethodref_info)getConstantFieldRefInfo(this,fp);
      break;
    case '\n':
      CVar3 = (CONSTANT_InterfaceMethodref_info)getConstantMethodRefInfo(this,fp);
      break;
    case '\v':
      CVar3 = getConstantInterfaceMethodRefInfo(this,fp);
      break;
    case '\f':
      CVar3 = (CONSTANT_InterfaceMethodref_info)getConstantNameAndTypeInfo(this,fp);
    }
    *(u2 *)&pcVar4[uVar8].info = CVar3.class_index;
    *(u2 *)((long)&pcVar4[uVar8].info + 2) = CVar3.name_and_type_index;
LAB_00110ca8:
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void ClassLoader::setConstantPool(FILE *fp, ClassFile *classFile) {
    u2 poolSize = classFile->constant_pool_count - 1;
    classFile->constant_pool = (cp_info*) malloc(sizeof(cp_info) * poolSize);
    
    cp_info *constant_pool = classFile->constant_pool;
    for (u2 i = 0; i < poolSize; i++) {
        u1 tag = readU1(fp);
        constant_pool[i].tag = tag;
        
        switch (tag) {
            case CONSTANT_Class:
                constant_pool[i].info.class_info = getConstantClassInfo(fp);
            break;
            case CONSTANT_Fieldref:
                constant_pool[i].info.fieldref_info = getConstantFieldRefInfo(fp);
            break;
            case CONSTANT_Methodref:
                constant_pool[i].info.methodref_info = getConstantMethodRefInfo(fp);
            break;
            case CONSTANT_InterfaceMethodref:
                constant_pool[i].info.interfaceMethodref_info = getConstantInterfaceMethodRefInfo(fp);
            break;
            case CONSTANT_String:
                constant_pool[i].info.string_info = getConstantStringInfo(fp);
            break;
            case CONSTANT_Integer:
                constant_pool[i].info.integer_info = getConstantIntegerInfo(fp);
            break;
            case CONSTANT_Float:
                constant_pool[i].info.float_info = getConstantFloatInfo(fp);
            break;
            case CONSTANT_Long:
                constant_pool[i].info.long_info = getConstantLongInfo(fp);
                constant_pool[++i].tag = CONSTANT_NULL;
            break;
            case CONSTANT_Double:
                constant_pool[i].info.double_info = getConstantDoubleInfo(fp);
                constant_pool[++i].tag = CONSTANT_NULL;
            break;
            case CONSTANT_NameAndType:
                constant_pool[i].info.nameAndType_info = getConstantNameAndTypeInfo(fp);
            break;
            case CONSTANT_Utf8:
                constant_pool[i].info.utf8_info = getConstantUtf8Info(fp);
            break;
            default:
                cerr << "Arquivo .class possui uma tag invalida no pool de constantes";
                exit(5);
        }
    }
}